

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_handle_destroy_notify(natwm_state *state,xcb_window_t window)

{
  workspace *pwVar1;
  client *client_00;
  natwm_error err;
  client *client;
  workspace *active_workspace;
  workspace *workspace;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  pwVar1 = workspace_list_find_window_workspace(state->workspace_list,window);
  if (pwVar1 == (workspace *)0x0) {
    pwVar1 = workspace_list_get_focused(state->workspace_list);
    workspace_reset_focus(state,pwVar1);
    state_local._4_4_ = NO_ERROR;
  }
  else {
    client_00 = workspace_find_window_client(pwVar1,window);
    if (client_00 == (client *)0x0) {
      internal_logger(natwm_logger,LEVEL_WARNING,"Failed to find client during destroy");
      state_local._4_4_ = NOT_FOUND_ERROR;
    }
    else {
      state_local._4_4_ = workspace_remove_client(state,pwVar1,client_00);
      if (state_local._4_4_ == NO_ERROR) {
        xcb_change_save_set(state->xcb,1,client_00->window);
        client_destroy(client_00);
        state_local._4_4_ = NO_ERROR;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,"Failed to remove client from workspace");
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_handle_destroy_notify(struct natwm_state *state, xcb_window_t window)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, window);

        if (workspace == NULL) {
                // This window is not registered with us
                struct workspace *active_workspace
                        = workspace_list_get_focused(state->workspace_list);

                workspace_reset_focus(state, active_workspace);

                return NO_ERROR;
        }

        struct client *client = workspace_find_window_client(workspace, window);

        if (client == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find client during destroy");

                return NOT_FOUND_ERROR;
        }

        enum natwm_error err = workspace_remove_client(state, workspace, client);

        if (err != NO_ERROR) {
                LOG_WARNING(natwm_logger, "Failed to remove client from workspace");

                return err;
        }

        xcb_change_save_set(state->xcb, XCB_SET_MODE_DELETE, client->window);

        client_destroy(client);

        return NO_ERROR;
}